

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::SkipElement(ColladaParser *this,char *pElement)

{
  int iVar1;
  string element;
  allocator local_31;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  std::__cxx11::string::string((string *)local_30,pElement,&local_31);
  do {
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar1 == '\0') goto LAB_003f7cb6;
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar1 != 2);
    (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar1 = std::__cxx11::string::compare((char *)local_30);
  } while (iVar1 != 0);
LAB_003f7cb6:
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

void ColladaParser::SkipElement(const char* pElement)
{
    // copy the current node's name because it'a pointer to the reader's internal buffer,
    // which is going to change with the upcoming parsing
    std::string element = pElement;
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
            if (mReader->getNodeName() == element)
                break;
    }
}